

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

cmNinjaTargetGenerator * cmNinjaTargetGenerator::New(cmGeneratorTarget *target)

{
  cmMakefile *this;
  uint uVar1;
  int iVar2;
  cmNinjaNormalTargetGenerator *this_00;
  char *__s1;
  char *__s2;
  
  uVar1 = cmGeneratorTarget::GetType(target);
  this_00 = (cmNinjaNormalTargetGenerator *)0x0;
  if (uVar1 < 5) {
    this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0x1a8);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(this_00,target);
  }
  else if (uVar1 == 5) {
    this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0xe8);
    cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
              ((cmNinjaUtilityTargetGenerator *)this_00,target);
  }
  else if (uVar1 == 6) {
    this = target->Target->Makefile;
    __s1 = cmMakefile::GetCurrentSourceDirectory(this);
    __s2 = cmMakefile::GetHomeDirectory(this);
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 == 0) {
      this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0xe8);
      cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
                ((cmNinjaUtilityTargetGenerator *)this_00,target);
    }
    else {
      this_00 = (cmNinjaNormalTargetGenerator *)0x0;
    }
  }
  return &this_00->super_cmNinjaTargetGenerator;
}

Assistant:

cmNinjaTargetGenerator *
cmNinjaTargetGenerator::New(cmGeneratorTarget* target)
{
  switch (target->GetType())
    {
      case cmTarget::EXECUTABLE:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::OBJECT_LIBRARY:
        return new cmNinjaNormalTargetGenerator(target);

      case cmTarget::UTILITY:
        return new cmNinjaUtilityTargetGenerator(target);;

      case cmTarget::GLOBAL_TARGET: {
        // We only want to process global targets that live in the home
        // (i.e. top-level) directory.  CMake creates copies of these targets
        // in every directory, which we don't need.
        cmMakefile *mf = target->Target->GetMakefile();
        if (strcmp(mf->GetCurrentSourceDirectory(),
                   mf->GetHomeDirectory()) == 0)
          return new cmNinjaUtilityTargetGenerator(target);
        // else fallthrough
      }

      default:
        return 0;
    }
}